

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteLoop<duckdb::string_t,double,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastStrictOperator<duckdb::TryCast>>
               (string_t *ldata,double *result_data,idx_t count,SelectionVector *sel_vector,
               ValidityMask *mask,ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  ValidityMask *pVVar1;
  ValidityMask *pVVar2;
  idx_t i;
  ValidityMask *pVVar3;
  double dVar4;
  string_t input;
  string_t input_00;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    pVVar2 = result_mask;
    for (pVVar3 = (ValidityMask *)0x0; (ValidityMask *)count != pVVar3;
        pVVar3 = (ValidityMask *)
                 ((long)&(pVVar3->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)) {
      pVVar1 = pVVar3;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        pVVar1 = (ValidityMask *)(ulong)sel_vector->sel_vector[(long)pVVar3];
      }
      input_00.value.pointer.ptr = (char *)result_mask;
      input_00.value._0_8_ = ldata[(long)pVVar1].value.pointer.ptr;
      dVar4 = VectorTryCastStrictOperator<duckdb::TryCast>::Operation<duckdb::string_t,double>
                        (*(VectorTryCastStrictOperator<duckdb::TryCast> **)
                          &ldata[(long)pVVar1].value,input_00,pVVar3,(idx_t)dataptr,pVVar2);
      result_data[(long)pVVar3] = dVar4;
    }
  }
  else {
    pVVar2 = result_mask;
    for (pVVar3 = (ValidityMask *)0x0; (ValidityMask *)count != pVVar3;
        pVVar3 = (ValidityMask *)
                 ((long)&(pVVar3->super_TemplatedValidityMask<unsigned_long>).validity_mask + 1)) {
      pVVar1 = pVVar3;
      if (sel_vector->sel_vector != (sel_t *)0x0) {
        pVVar1 = (ValidityMask *)(ulong)sel_vector->sel_vector[(long)pVVar3];
      }
      if (((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask[(ulong)pVVar1 >> 6] >>
           ((ulong)pVVar1 & 0x3f) & 1) == 0) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_mask->super_TemplatedValidityMask<unsigned_long>,(idx_t)pVVar3);
      }
      else {
        input.value.pointer.ptr = (char *)result_mask;
        input.value._0_8_ = ldata[(long)pVVar1].value.pointer.ptr;
        dVar4 = VectorTryCastStrictOperator<duckdb::TryCast>::Operation<duckdb::string_t,double>
                          (*(VectorTryCastStrictOperator<duckdb::TryCast> **)
                            &ldata[(long)pVVar1].value,input,pVVar3,(idx_t)dataptr,pVVar2);
        result_data[(long)pVVar3] = dVar4;
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector *__restrict sel_vector, ValidityMask &mask,
	                               ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
#ifdef DEBUG
		// ldata may point to a compressed dictionary buffer which can be smaller than ldata + count
		idx_t max_index = 0;
		for (idx_t i = 0; i < count; i++) {
			auto idx = sel_vector->get_index(i);
			max_index = MaxValue(max_index, idx);
		}
		ASSERT_RESTRICT(ldata, ldata + max_index, result_data, result_data + count);
#endif

		if (!mask.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				if (mask.RowIsValidUnsafe(idx)) {
					result_data[i] =
					    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
				} else {
					result_mask.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto idx = sel_vector->get_index(i);
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[idx], result_mask, i, dataptr);
			}
		}
	}